

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_library_interface
          (Impl *this,Value *lib,VkRayTracingPipelineInterfaceCreateInfoKHR **out_info)

{
  bool bVar1;
  VkRayTracingPipelineInterfaceCreateInfoKHR *pVVar2;
  Type pGVar3;
  Number NVar4;
  undefined8 local_30;
  
  pVVar2 = (VkRayTracingPipelineInterfaceCreateInfoKHR *)
           ScratchAllocator::allocate_raw(&this->allocator,0x18,0x10);
  if (pVVar2 != (VkRayTracingPipelineInterfaceCreateInfoKHR *)0x0) {
    *(undefined8 *)&pVVar2->field_0x4 = 0;
    *(undefined8 *)((long)&pVVar2->pNext + 4) = 0;
    pVVar2->maxPipelineRayHitAttributeSize = 0;
  }
  pVVar2->sType = VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_INTERFACE_CREATE_INFO_KHR;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)lib,"maxPipelineRayPayloadSize");
  if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar2->maxPipelineRayPayloadSize = (pGVar3->data_).s.length;
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)lib,"maxPipelineRayHitAttributeSize");
    if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      pVVar2->maxPipelineRayHitAttributeSize = (pGVar3->data_).s.length;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&stack0xffffffffffffffd0,(Ch *)lib);
      NVar4.i = (I)rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberEnd(lib);
      if (local_30 != NVar4.i64) {
        pGVar3 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)lib,"pNext");
        bVar1 = parse_pnext_chain(this,pGVar3,&pVVar2->pNext,(StateCreatorInterface *)0x0,
                                  (DatabaseInterface *)0x0,(Value *)0x0);
        if (!bVar1) {
          return false;
        }
      }
      *out_info = pVVar2;
      return true;
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_library_interface(const Value &lib,
                                                  const VkRayTracingPipelineInterfaceCreateInfoKHR **out_info)
{
	auto *state = allocator.allocate_cleared<VkRayTracingPipelineInterfaceCreateInfoKHR>();

	state->sType = VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_INTERFACE_CREATE_INFO_KHR;
	state->maxPipelineRayPayloadSize = lib["maxPipelineRayPayloadSize"].GetUint();
	state->maxPipelineRayHitAttributeSize = lib["maxPipelineRayHitAttributeSize"].GetUint();

	if (lib.HasMember("pNext"))
		if (!parse_pnext_chain(lib["pNext"], &state->pNext))
			return false;

	*out_info = state;
	return true;
}